

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O3

void __thiscall LongReadsMapper::update_indexes(LongReadsMapper *this)

{
  vector<long,_std::allocator<long>_> *this_00;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_02;
  uint uVar1;
  LongReadMapping *pLVar2;
  pointer pLVar3;
  long lVar4;
  pointer pvVar5;
  iterator __position;
  bool bVar6;
  ostream *poVar7;
  ulong uVar8;
  pointer plVar9;
  long lVar10;
  LongReadMapping *other;
  pointer pLVar11;
  long lVar12;
  LongReadMapping *this_03;
  unsigned_long local_38;
  
  this_03 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  other = this_03;
  if (this_03 != pLVar2) {
    do {
      this_03 = other + 1;
      if (this_03 == pLVar2) goto LAB_001a24b1;
      bVar6 = LongReadMapping::operator<(this_03,other);
      other = this_03;
    } while (!bVar6);
  }
  if (this_03 != pLVar2) {
    poVar7 = sdglib::OutputLog(INFO,true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Sorting mappings",0x10);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    pLVar11 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar3 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pLVar11 != pLVar3) {
      uVar8 = (long)pLVar3 - (long)pLVar11 >> 5;
      lVar12 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pLVar11,pLVar3,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<LongReadMapping*,std::vector<LongReadMapping,std::allocator<LongReadMapping>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pLVar11,pLVar3);
    }
  }
LAB_001a24b1:
  this_01 = &this->reads_in_node;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_erase_at_end(this_01,(this->reads_in_node).
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_01,((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  this_00 = &this->first_mapping;
  plVar9 = (this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar9) {
    (this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar9;
  }
  local_38 = 0xffffffffffffffff;
  std::vector<long,_std::allocator<long>_>::resize
            (this_00,(long)(this->datastore->read_to_fileRecord).
                           super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->datastore->read_to_fileRecord).
                           super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                           super__Vector_impl_data._M_start >> 4,(value_type_conflict *)&local_38);
  pLVar11 = (this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->mappings).super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl
      .super__Vector_impl_data._M_finish != pLVar11) {
    lVar12 = 8;
    uVar8 = 0;
    do {
      plVar9 = (this->first_mapping).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = *(uint *)((long)&pLVar11->node + lVar12);
      local_38 = (unsigned_long)uVar1;
      if ((ulong)((long)(this->first_mapping).super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)plVar9 >> 3) <= local_38)
      {
        local_38 = 0xffffffffffffffff;
        std::vector<long,_std::allocator<long>_>::resize
                  (this_00,(ulong)(uVar1 + 1),(value_type_conflict *)&local_38);
        local_38 = (unsigned_long)*(uint *)((long)&pLVar11->node + lVar12);
        plVar9 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      if (plVar9[local_38] == -1) {
        plVar9[local_38] = uVar8;
      }
      lVar4 = *(long *)((long)pLVar11 + lVar12 + -8);
      lVar10 = -lVar4;
      if (0 < lVar4) {
        lVar10 = lVar4;
      }
      pvVar5 = (this_01->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __position._M_current =
           *(pointer *)
            ((long)&pvVar5[lVar10].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data + 8);
      if ((pvVar5[lVar10].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start == __position._M_current) ||
         (__position._M_current[-1] != local_38)) {
        this_02 = pvVar5 + lVar10;
        if (__position._M_current ==
            (this_02->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>(this_02,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          (this_02->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar8 = uVar8 + 1;
      pLVar11 = (this->mappings).
                super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x20;
    } while (uVar8 < (ulong)((long)(this->mappings).
                                   super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar11 >> 5))
    ;
  }
  return;
}

Assistant:

void LongReadsMapper::update_indexes() {
    if (!std::is_sorted(mappings.begin(), mappings.end())) {
        sdglib::OutputLog() << "Sorting mappings" << std::endl;
        sdglib::sort(mappings.begin(), mappings.end());
    }
    reads_in_node.clear();
    reads_in_node.resize(sg.nodes.size());
    first_mapping.clear();
    first_mapping.resize(datastore.size()+1,-1);
    for (int64_t i=0;i<mappings.size();++i){
        auto &m=mappings[i];
        if (first_mapping.size()<=m.read_id) first_mapping.resize(m.read_id+1,-1);
        if (first_mapping[m.read_id]==-1) first_mapping[m.read_id]=i;
        if (reads_in_node[std::abs(m.node)].empty() or reads_in_node[std::abs(m.node)].back()!=m.read_id)
            reads_in_node[std::abs(m.node)].push_back(m.read_id);
    }
}